

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall
AbstractTxIn_WitnessStack_Test::~AbstractTxIn_WitnessStack_Test
          (AbstractTxIn_WitnessStack_Test *this)

{
  AbstractTxIn_WitnessStack_Test *this_local;
  
  ~AbstractTxIn_WitnessStack_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStack) {
  std::vector<ByteData> expect_stack;
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  const auto checkWitnessStack =
      [](AbstractTxIn actual, std::vector<ByteData> expect_stack) -> void {
        EXPECT_STREQ(expect_txid.GetHex().c_str(),
            actual.GetTxid().GetHex().c_str());
        EXPECT_EQ(expect_index, actual.GetVout());
        EXPECT_STREQ(expect_txid.GetHex().c_str(),
            actual.GetOutPoint().GetTxid().GetHex().c_str());
        EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
        EXPECT_EQ(expect_sequence, actual.GetSequence());
        EXPECT_STREQ(expect_script_hex.c_str(),
            actual.GetUnlockingScript().GetScript().GetHex().c_str());

        EXPECT_EQ(expect_stack.size(), actual.GetScriptWitnessStackNum());
        std::vector<ByteData> actual_stack = actual.GetScriptWitness().GetWitness();
        for (size_t i = 0; i < actual.GetScriptWitnessStackNum(); ++i) {
          EXPECT_TRUE(expect_stack[i].Equals(actual_stack[i]));
        }
      };

  const auto addWitnessStack = [&actual, &expect_stack](ByteData data) -> void {
    actual.AddScriptWitnessStack(data);
    expect_stack.push_back(data);
  };

  const auto setWitnessStack =
      [&actual, &expect_stack](uint32_t index, ByteData data) -> void {
        ASSERT_NO_THROW(actual.SetScriptWitnessStack(index, data));
        expect_stack[index] = data;
      };

  const auto removeWitnessStack = [&actual, &expect_stack]() -> void {
    actual.RemoveScriptWitnessStackAll();
    expect_stack.clear();
  };

  checkWitnessStack(actual, expect_stack);
  addWitnessStack(ByteData("1111"));
  addWitnessStack(ByteData("aaaa"));
  addWitnessStack(ByteData("3333"));
  checkWitnessStack(actual, expect_stack);
  setWitnessStack(1, ByteData("2222"));
  checkWitnessStack(actual, expect_stack);
  removeWitnessStack();
  addWitnessStack(ByteData("aaaa"));
  checkWitnessStack(actual, expect_stack);
}